

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
::reserve(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *this,size_t n)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (uVar3 != 1) {
    if (uVar3 == 0) {
      __assert_fail("cap >= kDefaultCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb75,
                    "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>]"
                   );
    }
    AssertNotDebugCapacity(this);
    uVar3 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_;
    sVar2 = growth_left(this);
    uVar3 = sVar2 + (uVar3 >> 1);
  }
  if (uVar3 < n) {
    if (n < 0x380000000000001) {
      uVar3 = (n - 1) / 7 + n;
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      resize_impl(this,0xffffffffffffffff >> (~(byte)lVar1 & 0x3f));
      infoz(this);
      return;
    }
    HashTableSizeOverflow();
  }
  return;
}

Assistant:

void reserve(size_t n) {
    const size_t max_size_before_growth =
        is_soo() ? SooCapacity() : size() + growth_left();
    if (n > max_size_before_growth) {
      if (ABSL_PREDICT_FALSE(n > max_size())) {
        HashTableSizeOverflow();
      }
      size_t m = GrowthToLowerboundCapacity(n);
      resize(NormalizeCapacity(m));

      // This is after resize, to ensure that we have completed the allocation
      // and have potentially sampled the hashtable.
      infoz().RecordReservation(n);
    }
    common().reset_reserved_growth(n);
    common().set_reservation_size(n);
  }